

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastunpack29_8(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = *in;
  *out = uVar1 & 0x1fffffff;
  uVar2 = in[1];
  out[1] = uVar1 >> 0x1d;
  out[1] = uVar1 >> 0x1d | (uVar2 & 0x3ffffff) << 3;
  out[2] = uVar2 >> 0x1a;
  uVar1 = in[2];
  out[2] = uVar2 >> 0x1a | (uVar1 & 0x7fffff) << 6;
  out[3] = uVar1 >> 0x17;
  uVar2 = in[3];
  out[3] = uVar1 >> 0x17 | (uVar2 & 0xfffff) << 9;
  uVar1 = in[4];
  out[4] = uVar2 >> 0x14;
  out[4] = uVar2 >> 0x14 | (uVar1 & 0x1ffff) << 0xc;
  out[5] = uVar1 >> 0x11;
  uVar2 = in[5];
  out[5] = uVar1 >> 0x11 | (uVar2 & 0x3fff) << 0xf;
  out[6] = uVar2 >> 0xe;
  uVar1 = in[6];
  out[6] = uVar2 >> 0xe | (uVar1 & 0x7ff) << 0x12;
  uVar2 = in[7];
  out[7] = uVar1 >> 0xb;
  out[7] = (uVar2 & 0xff) << 0x15 | uVar1 >> 0xb;
  return in + 8;
}

Assistant:

const uint32_t *__fastunpack29_8(const uint32_t *__restrict__ in,
                                 uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 29);
  out++;
  *out = ((*in) >> 29);
  ++in;
  *out |= ((*in) % (1U << 26)) << (29 - 26);
  out++;
  *out = ((*in) >> 26);
  ++in;
  *out |= ((*in) % (1U << 23)) << (29 - 23);
  out++;
  *out = ((*in) >> 23);
  ++in;
  *out |= ((*in) % (1U << 20)) << (29 - 20);
  out++;
  *out = ((*in) >> 20);
  ++in;
  *out |= ((*in) % (1U << 17)) << (29 - 17);
  out++;
  *out = ((*in) >> 17);
  ++in;
  *out |= ((*in) % (1U << 14)) << (29 - 14);
  out++;
  *out = ((*in) >> 14);
  ++in;
  *out |= ((*in) % (1U << 11)) << (29 - 11);
  out++;
  *out = ((*in) >> 11);
  ++in;
  *out |= ((*in) % (1U << 8)) << (29 - 8);
  out++;

  return in + 1;
}